

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImGuiTabItem *pIVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint3 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  char *label_00;
  ImGuiWindow *pIVar9;
  ulong uVar10;
  short sVar11;
  ImU32 id;
  uint uVar12;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar13;
  ImGuiTabItem *pIVar14;
  size_t sVar15;
  ImGuiWindow *extraout_RAX;
  undefined7 uVar18;
  char *pcVar17;
  ImS8 IVar19;
  int iVar20;
  ImGuiDockNode *pIVar21;
  int iVar22;
  ImVec2 tab;
  ImGuiCol idx;
  ulong uVar23;
  ImGuiTabItem *pIVar24;
  undefined1 uVar25;
  uint flags_00;
  bool bVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar30;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar31;
  float fVar32;
  ImVec2 IVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  bool text_clipped;
  bool just_closed;
  ImGuiWindow *local_a8;
  ImGuiContext *local_a0;
  ImRect bb;
  bool held;
  float local_7c;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  char *local_68;
  ImGuiWindow *local_60;
  undefined4 local_54;
  ImVec2 local_50;
  bool hovered;
  undefined7 uStack_47;
  float fStack_44;
  bool *local_40;
  int local_34;
  ImGuiWindow *pIVar16;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  local_a0 = GImGui;
  pIVar16 = GImGui->CurrentWindow;
  if (pIVar16->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label,docked_window);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  if (((uint)flags >> 0x15 & 1) != 0 && p_open != (bool *)0x0) {
    __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1da8,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  local_60 = pIVar16;
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1da9,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  local_40 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_40 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar33 = TabItemCalcSize(label,local_40 != (bool *)0x0);
  fVar29 = IVar33.x;
  fVar28 = IVar33.y;
  if (id == 0) {
LAB_001711b1:
    p_open = (bool *)0x0;
  }
  else {
    uVar13 = (ulong)(tab_bar->Tabs).Size;
    bVar26 = 0 < (long)uVar13;
    if (0 < (long)uVar13) {
      p_open = (bool *)(tab_bar->Tabs).Data;
      bVar26 = true;
      if (((ImGuiTabItem *)p_open)->ID != id) {
        pIVar14 = (ImGuiTabItem *)((long)p_open + (uVar13 - 1) * 0x30);
        uVar10 = 1;
        pIVar24 = (ImGuiTabItem *)p_open;
        do {
          uVar23 = uVar10;
          p_open = (bool *)pIVar14;
          if (uVar13 == uVar23) break;
          p_open = (bool *)(pIVar24 + 1);
          pIVar1 = pIVar24 + 1;
          uVar10 = uVar23 + 1;
          pIVar24 = (ImGuiTabItem *)p_open;
        } while (pIVar1->ID != id);
        bVar26 = uVar23 < uVar13;
      }
    }
    if (!bVar26) goto LAB_001711b1;
  }
  tab = (ImVec2)p_open;
  uVar30 = extraout_XMM0_Dc;
  uVar31 = extraout_XMM0_Dd;
  local_a8 = docked_window;
  if ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0) {
    iVar22 = (tab_bar->Tabs).Size;
    iVar2 = (tab_bar->Tabs).Capacity;
    uVar30 = extraout_XMM0_Dc;
    uVar31 = extraout_XMM0_Dd;
    if (iVar22 == iVar2) {
      iVar22 = iVar22 + 1;
      if (iVar2 == 0) {
        iVar20 = 8;
      }
      else {
        iVar20 = iVar2 / 2 + iVar2;
      }
      if (iVar22 < iVar20) {
        iVar22 = iVar20;
      }
      uVar30 = extraout_XMM0_Dc;
      uVar31 = extraout_XMM0_Dd;
      if (iVar2 < iVar22) {
        uStack_70._0_4_ = extraout_XMM0_Dc;
        local_78._0_4_ = IVar33.x;
        local_78._4_4_ = IVar33.y;
        uStack_70._4_4_ = extraout_XMM0_Dd;
        pIVar14 = (ImGuiTabItem *)MemAlloc((long)iVar22 * 0x30);
        pIVar24 = (tab_bar->Tabs).Data;
        if (pIVar24 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar14,pIVar24,(long)(tab_bar->Tabs).Size * 0x30);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar14;
        (tab_bar->Tabs).Capacity = iVar22;
        fVar29 = (float)local_78._0_4_;
        fVar28 = (float)local_78._4_4_;
        uVar30 = (undefined4)uStack_70;
        uVar31 = uStack_70._4_4_;
      }
    }
    pIVar14 = (tab_bar->Tabs).Data;
    iVar22 = (tab_bar->Tabs).Size;
    pIVar24 = pIVar14 + iVar22;
    pIVar24->ID = 0;
    pIVar24->Flags = 0;
    pIVar24->Window = (ImGuiWindow *)0x0;
    pIVar14[iVar22].LastFrameVisible = -1;
    pIVar14[iVar22].LastFrameSelected = -1;
    pIVar24 = pIVar14 + iVar22;
    pIVar24->ContentWidth = 0.0;
    pIVar24->NameOffset = -1;
    pIVar24->BeginOrder = -1;
    pIVar14[iVar22].Offset = 0.0;
    pIVar14[iVar22].Width = 0.0;
    pIVar14[iVar22].IndexDuringLayout = -1;
    *(undefined4 *)&pIVar14[iVar22].WantClose = 0;
    *(undefined2 *)&pIVar14[iVar22].field_0x2e = 0;
    iVar22 = (tab_bar->Tabs).Size;
    uVar3 = iVar22 + 1;
    (tab_bar->Tabs).Size = uVar3;
    if (iVar22 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                    ,0x5cc,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar24 = (tab_bar->Tabs).Data;
    tab = (ImVec2)(pIVar24 + ((ulong)uVar3 - 1));
    ((ImGuiTabItem *)tab)->ID = id;
    pIVar24[(ulong)uVar3 - 1].Width = fVar29;
    tab_bar->TabsAddedNew = true;
  }
  pIVar24 = (tab_bar->Tabs).Data;
  local_68 = label;
  if (((ulong)tab < pIVar24) || (pIVar24 + (tab_bar->Tabs).Size <= (ulong)tab)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                  ,0x5e3,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)SUB84(tab,0) - (int)pIVar24) >> 4) * -0x5555;
  ((ImGuiTabItem *)tab)->ContentWidth = fVar29;
  sVar11 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar11 + 1;
  ((ImGuiTabItem *)tab)->BeginOrder = sVar11;
  uVar3 = tab_bar->Flags;
  iVar22 = tab_bar->PrevFrameVisible;
  iVar2 = local_a0->FrameCount;
  iVar20 = ((ImGuiTabItem *)tab)->LastFrameVisible;
  ((ImGuiTabItem *)tab)->LastFrameVisible = iVar2;
  ((ImGuiTabItem *)tab)->Flags = flags_00;
  ((ImGuiTabItem *)tab)->Window = local_a8;
  if (local_a8 == (ImGuiWindow *)0x0) {
    iVar4 = (tab_bar->TabsNames).Buf.Size;
    sVar11 = (short)iVar4 + -1;
    if (iVar4 == 0) {
      sVar11 = 0;
    }
    ((ImGuiTabItem *)tab)->NameOffset = sVar11;
    local_78._4_4_ = fVar28;
    local_78._0_4_ = fVar29;
    uStack_70._0_4_ = uVar30;
    uStack_70._4_4_ = uVar31;
    local_50 = tab;
    sVar15 = strlen(label);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar15 + 1);
    pIVar16 = extraout_RAX;
    tab = local_50;
    fVar28 = (float)local_78._4_4_;
  }
  else {
    if ((uVar3 >> 0x14 & 1) == 0) {
      __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x1dd0,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    ((ImGuiTabItem *)tab)->NameOffset = -1;
    pIVar16 = local_a8;
  }
  pIVar9 = local_60;
  uVar13 = uStack_70;
  iVar22 = iVar22 + 1;
  iVar20 = iVar20 + 1;
  if (((iVar20 < iVar2) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar22 < iVar2) {
      uVar12 = flags_00 & 0x200000 | tab_bar->SelectedTabId;
      pIVar16 = (ImGuiWindow *)(ulong)uVar12;
    }
    else {
      uVar12 = flags_00 >> 0x15 & 1;
    }
    if (uVar12 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) &&
     (pIVar16 = (ImGuiWindow *)(ulong)(flags_00 & 0x200000), (flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar18 = (undefined7)((ulong)pIVar16 >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_78 = (undefined1  [8])CONCAT71(uVar18,1);
LAB_00171414:
    _local_78 = CONCAT88(uVar13,local_78);
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uStack_70;
    _local_78 = auVar6 << 0x40;
    if (((tab_bar->SelectedTabId == 0) && (local_a8 == (ImGuiWindow *)0x0)) && (iVar22 < iVar2)) {
      if ((tab_bar->Tabs).Size == 1) {
        local_78 = (undefined1  [8])CONCAT71(uVar18,(tab_bar->Flags & 2) == 0);
        goto LAB_00171414;
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar13;
      _local_78 = auVar7 << 0x40;
    }
  }
  if ((iVar20 < iVar2) && ((ImGuiTabItem *)p_open == (ImGuiTabItem *)0x0 || iVar2 <= iVar22)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((flags_00 >> 0x15 & 1) == 0 & local_78[0]);
  }
  if (tab_bar->SelectedTabId == id) {
    ((ImGuiTabItem *)tab)->LastFrameSelected = local_a0->FrameCount;
  }
  uVar12 = ((ImGuiTabItem *)tab)->Flags;
  fVar29 = ((ImGuiTabItem *)tab)->Width;
  fVar32 = ((ImGuiTabItem *)tab)->Offset;
  if ((uVar12 & 0xc0) == 0) {
    fVar32 = (float)(int)(fVar32 - tab_bar->ScrollingAnim);
  }
  IVar33.x = fVar32 + (tab_bar->BarRect).Min.x;
  local_50 = (local_60->DC).CursorPos;
  IVar33.y = (tab_bar->BarRect).Min.y + 0.0;
  (local_60->DC).CursorPos = IVar33;
  fVar32 = (local_60->DC).CursorPos.x;
  fVar34 = (local_60->DC).CursorPos.y;
  bb.Min = (local_60->DC).CursorPos;
  bb.Max.x = fVar29 + fVar32;
  fVar28 = fVar28 + fVar34;
  bb.Max.y = fVar28;
  if ((uVar12 & 0xc0) == 0) {
    uVar5 = (uint3)(uVar12 >> 8);
    local_54 = (undefined4)CONCAT71((uint7)uVar5,1);
    if (tab_bar->ScrollingRectMinX <= fVar32) {
      local_54 = CONCAT31(uVar5,tab_bar->ScrollingRectMaxX <= bb.Max.x &&
                                bb.Max.x != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    local_54 = 0;
  }
  local_34 = iVar2;
  if ((char)local_54 != '\0') {
    uVar12 = -(uint)(tab_bar->ScrollingRectMinX <= fVar32);
    fStack_44 = fVar34 + -1.0;
    _hovered = (float)(~uVar12 & (uint)tab_bar->ScrollingRectMinX | (uint)fVar32 & uVar12);
    _held = tab_bar->ScrollingRectMaxX;
    local_7c = fVar28;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  pIVar8 = local_a0;
  IVar33 = (pIVar9->DC).CursorMaxPos;
  fStack_44 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(local_a0->Style).FramePadding.y);
  (pIVar9->DC).CursorMaxPos = IVar33;
  bVar26 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar26) {
    uVar25 = local_78[0];
    if ((char)local_54 != '\0') {
      PopClipRect();
    }
    (local_60->DC).CursorPos = local_50;
    return (bool)uVar25;
  }
  uVar12 = (flags_00 >> 0x11 & 0x10) + 0x1010;
  if (pIVar8->DragDropActive == true) {
    if ((pIVar8->DragDropPayload).DataFrameCount == -1) {
      bVar26 = false;
    }
    else {
      iVar22 = strcmp("_IMWINDOW",(pIVar8->DragDropPayload).DataType);
      bVar26 = iVar22 == 0;
    }
    if (!bVar26) {
      uVar12 = uVar12 | 0x200;
    }
  }
  bVar26 = ButtonBehavior(&bb,id,&hovered,&held,uVar12);
  pIVar16 = local_60;
  if ((flags_00 >> 0x15 & 1) == 0 && bVar26) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | local_a0->HoveredId == id);
  if (((held == true && local_a8 != (ImGuiWindow *)0x0) && (local_a0->ActiveId == id)) &&
     (local_a0->ActiveIdIsJustActivated == true)) {
    local_a0->ActiveIdWindow = local_a8;
  }
  if (held == false) {
    SetItemAllowOverlap();
  }
  if (local_a8 == (ImGuiWindow *)0x0) {
    pIVar21 = (ImGuiDockNode *)0x0;
  }
  else {
    pIVar21 = local_a8->DockNode;
  }
  bVar27 = true;
  if (((pIVar21 != (ImGuiDockNode *)0x0) && (pIVar21->ParentNode == (ImGuiDockNode *)0x0)) &&
     ((pIVar21->LocalFlags & 0x400U) == 0)) {
    bVar27 = (pIVar21->Windows).Size != 1;
  }
  if (((held != true) || (bVar27)) || (bVar27 = IsMouseDragging(0,0.0), !bVar27)) {
    if (((held == true) && (local_34 <= iVar20)) && (bVar27 = IsMouseDragging(0,-1.0), bVar27)) {
      bVar27 = local_a0->DragDropActive;
      fVar29 = 0.0;
      if ((bVar27 == false) &&
         (uVar12 = tab_bar->Flags, local_a8 != (ImGuiWindow *)0x0 || (uVar12 & 1) != 0)) {
        fVar28 = (local_a0->IO).MouseDelta.x;
        if (0.0 <= fVar28) {
LAB_0017182c:
          if (0.0 < fVar28) {
            fVar28 = (local_a0->IO).MousePos.x;
            if ((bb.Max.x < fVar28) && (fVar29 = fVar28 - bb.Max.x, (uVar12 & 1) != 0)) {
              IVar19 = '\x01';
              goto LAB_0017184f;
            }
          }
        }
        else {
          fVar32 = (local_a0->IO).MousePos.x;
          if (bb.Min.x <= fVar32) goto LAB_0017182c;
          fVar29 = bb.Min.x - fVar32;
          if ((uVar12 & 1) == 0) goto LAB_00171865;
          IVar19 = -1;
LAB_0017184f:
          if (tab_bar->ReorderRequestTabId != 0) {
            __assert_fail("tab_bar->ReorderRequestTabId == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                          ,0x1cc4,
                          "void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                         );
          }
          tab_bar->ReorderRequestTabId = ((ImGuiTabItem *)tab)->ID;
          tab_bar->ReorderRequestDir = IVar19;
        }
      }
LAB_00171865:
      if ((local_a8 != (ImGuiWindow *)0x0) && ((local_a8->Flags & 4) == 0)) {
        if (bVar27 == false) {
          bVar27 = false;
        }
        else {
          bVar27 = (local_a0->DragDropPayload).SourceId == id;
        }
        if (!bVar27) {
          fVar28 = local_a0->FontSize;
          fVar34 = (ABS((local_a0->IO).MouseDragMaxDistanceAbs[0].x) - (fVar28 + fVar28)) * 0.2;
          fVar32 = fVar28 * 4.0;
          if (fVar34 <= fVar28 * 4.0) {
            fVar32 = fVar34;
          }
          fVar36 = (local_a0->IO).MousePos.y;
          fVar35 = bb.Min.y - fVar36;
          fVar36 = fVar36 - bb.Max.y;
          uVar12 = -(uint)(fVar36 <= fVar35);
          if (((float)(~uVar12 & (uint)fVar36 | (uint)fVar35 & uVar12) <
               fVar28 * 1.5 + (float)(~-(uint)(fVar34 < 0.0) & (uint)fVar32)) &&
             ((fVar29 <= fVar28 * 2.2 ||
              (((-1 < tab_bar->ReorderRequestDir ||
                (iVar22 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)tab), iVar22 != 0)) &&
               ((tab_bar->ReorderRequestDir < '\x01' ||
                (iVar22 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)tab),
                iVar22 != (tab_bar->Tabs).Size + -1)))))))) goto LAB_001719fa;
        }
        pIVar8 = local_a0;
        pIVar16 = local_a8;
        DockContextQueueUndockWindow(local_a0,local_a8);
        pIVar8->MovingWindow = pIVar16;
        SetActiveID(pIVar16->MoveId,pIVar16);
        fVar29 = (pIVar8->MovingWindow->Pos).y;
        (pIVar8->ActiveIdClickOffset).x =
             (pIVar8->ActiveIdClickOffset).x - ((pIVar8->MovingWindow->Pos).x - bb.Min.x);
        (pIVar8->ActiveIdClickOffset).y = (pIVar8->ActiveIdClickOffset).y - (fVar29 - bb.Min.y);
        pIVar8->ActiveIdNoClearOnFocusLoss = true;
        pIVar16 = local_60;
      }
    }
  }
  else {
    StartMouseMovingWindow(local_a8);
  }
LAB_001719fa:
  label_00 = local_68;
  local_a8 = (ImGuiWindow *)pIVar16->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (local_78[0] == '\0') {
      idx = (uint)((uVar3 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar3 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  local_68 = (char *)CONCAT71(local_68._1_7_,bVar26);
  col = GetColorU32(idx,1.0);
  TabItemBackground((ImDrawList *)local_a8,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar26 = IsItemHovered(8);
  if (bVar26) {
    bVar26 = IsMouseClicked(1,false);
    if (bVar26) {
      uVar3 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar26 = IsMouseReleased(1);
      if (!bVar26) goto LAB_00171adc;
      uVar3 = flags_00 & 0x200000;
    }
    if (uVar3 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00171adc:
  uVar3 = tab_bar->Flags;
  if (local_40 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  pIVar8 = local_a0;
  TabItemLabelAndCloseButton
            ((ImDrawList *)local_a8,&bb,uVar3 >> 1 & 4 | flags_00,tab_bar->FramePadding,label_00,id,
             close_button_id,(bool)local_78[0],&just_closed,&text_clipped);
  if ((local_40 != (bool *)0x0) && (just_closed != false)) {
    *local_40 = false;
    TabBarCloseTab(tab_bar,(ImGuiTabItem *)tab);
  }
  if ((char)local_54 != '\0') {
    PopClipRect();
  }
  (local_60->DC).CursorPos = local_50;
  if (((((text_clipped == true) && (pIVar8->HoveredId == id)) && (held == false)) &&
      ((0.5 < pIVar8->HoveredIdNotActiveTimer && (bVar26 = IsItemHovered(0), bVar26)))) &&
     (((tab_bar->Flags & 0x20) == 0 && ((((ImGuiTabItem *)tab)->Flags & 0x10) == 0)))) {
    pcVar17 = FindRenderedTextEnd(label_00,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar17 - (int)label_00),label_00);
  }
  uVar25 = local_78[0];
  if (((flags_00 >> 0x15 & 1) != 0) &&
     (uVar25 = local_68._0_1_, tab_bar->SelectedTabId == ((ImGuiTabItem *)tab)->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                  ,0x1e9c,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  return (bool)uVar25;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label, docked_window);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    // (regular tabs are permitted in a DockNode tab bar, but window tabs not permitted in a non-DockNode tab bar)
    if (tab->Window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                SetActiveID(g.MovingWindow->MoveId, g.MovingWindow);
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
                g.ActiveIdNoClearOnFocusLoss = true;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}